

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::ReadData(JSONStringifier *this,RecyclableObject *valueObj,JSONProperty *prop)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  charcount_t rhs;
  uint32 uVar5;
  undefined4 *puVar6;
  JavascriptBoolean *this_00;
  JavascriptTypedNumber<long> *this_01;
  long lVar7;
  JavascriptTypedNumber<unsigned_long> *this_02;
  unsigned_long uVar8;
  JavascriptString *ptr;
  JavascriptString **ppJVar9;
  undefined1 auVar10 [16];
  TypeId typeId;
  JSONProperty *prop_local;
  RecyclableObject *valueObj_local;
  JSONStringifier *this_local;
  TypeId typeId_1;
  
  if (valueObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  TVar3 = RecyclableObject::GetTypeId(valueObj);
  if ((0x57 < (int)TVar3) && (BVar4 = RecyclableObject::IsExternal(valueObj), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  switch(TVar3) {
  case TypeIds_Undefined:
  case TypeIds_Symbol:
    prop->type = Undefined;
    break;
  case TypeIds_Null:
    SetNullProperty(this,prop);
    break;
  case TypeIds_Boolean:
    this_00 = UnsafeVarTo<Js::JavascriptBoolean,Js::RecyclableObject>(valueObj);
    BVar4 = JavascriptBoolean::GetValue(this_00);
    if (BVar4 == 0) {
      prop->type = False;
      uVar5 = UInt32Math::Add(this->totalStringLength,5);
      this->totalStringLength = uVar5;
    }
    else {
      prop->type = True;
      uVar5 = UInt32Math::Add(this->totalStringLength,4);
      this->totalStringLength = uVar5;
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                ,0x305,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    prop->type = Undefined;
    break;
  case TypeIds_Int64Number:
    this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(valueObj);
    lVar7 = JavascriptTypedNumber<long>::GetValue(this_01);
    SetNumericProperty(this,(double)lVar7,valueObj,prop);
    break;
  case TypeIds_LastNumberType:
    this_02 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(valueObj);
    uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
    auVar10._8_4_ = (int)(uVar8 >> 0x20);
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = 0x45300000;
    SetNumericProperty(this,(auVar10._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0),valueObj,
                       prop);
    break;
  case TypeIds_String:
    ptr = UnsafeVarTo<Js::JavascriptString,Js::RecyclableObject>(valueObj);
    Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
              ((WriteBarrierPtr<Js::JavascriptString> *)&(prop->field_1).numericValue,ptr);
    prop->type = String;
    uVar5 = this->totalStringLength;
    ppJVar9 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                        ((WriteBarrierPtr *)&(prop->field_1).numericValue);
    rhs = CalculateStringElementLength(*ppJVar9);
    uVar5 = UInt32Math::Add(uVar5,rhs);
    this->totalStringLength = uVar5;
  }
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ RecyclableObject* valueObj, _Out_ JSONProperty* prop)
{
    TypeId typeId = JavascriptOperators::GetTypeId(valueObj);

    switch (typeId)
    {
    case TypeIds_Null:
        this->SetNullProperty(prop);
        return;

    case TypeIds_Boolean:
        if (UnsafeVarTo<JavascriptBoolean>(valueObj)->GetValue() != FALSE)
        {
            prop->type = JSONContentType::True;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::TrueStringLength);
        }
        else
        {
            prop->type = JSONContentType::False;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::FalseStringLength);
        }
        return;

    case TypeIds_Int64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

    case TypeIds_UInt64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptUInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

#if !FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(valueObj), valueObj, prop);
        return;
#endif

    case TypeIds_String:
        prop->stringValue = UnsafeVarTo<JavascriptString>(valueObj);
        prop->type = JSONContentType::String;
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, CalculateStringElementLength(prop->stringValue));
        return;

    case TypeIds_Symbol:
        // Treat symbols as undefined
    case TypeIds_Undefined:
        // If undefined is in an object, it is not included in the string, and if it is an array element it will show up as "null"
        // Given that, we can't caluclate the string length here and instead we do it at the usage points
        prop->type = JSONContentType::Undefined;
        return;

    default:
        Assert(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}